

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::BitState<unsigned_short>,short,duckdb::BitXorOperation>
               (short *idata,AggregateInputData *aggr_input_data,BitState<unsigned_short> *state,
               idx_t count,ValidityMask *mask,SelectionVector *sel_vector)

{
  bool bVar1;
  BitState<unsigned_short> *in_RCX;
  AggregateInputData *in_RSI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  SelectionVector *in_R9;
  idx_t i_1;
  idx_t i;
  AggregateUnaryInput input;
  short *in_stack_ffffffffffffffa8;
  BitState<unsigned_short> *pBVar2;
  BitState<unsigned_short> *in_stack_ffffffffffffffb0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  
  AggregateUnaryInput::AggregateUnaryInput
            ((AggregateUnaryInput *)&stack0xffffffffffffffb8,in_RSI,(ValidityMask *)in_R8);
  bVar1 = BitwiseOperation::IgnoreNull();
  if ((!bVar1) || (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8), bVar1)) {
    for (pBVar2 = (BitState<unsigned_short> *)0x0; pBVar2 < in_RCX;
        pBVar2 = (BitState<unsigned_short> *)&pBVar2->field_0x1) {
      SelectionVector::get_index(in_R9,(idx_t)pBVar2);
      BitwiseOperation::Operation<short,duckdb::BitState<unsigned_short>,duckdb::BitXorOperation>
                (in_stack_ffffffffffffffb0,(short *)pBVar2,(AggregateUnaryInput *)0x98b165);
    }
  }
  else {
    for (pBVar2 = (BitState<unsigned_short> *)0x0; pBVar2 < in_RCX;
        pBVar2 = (BitState<unsigned_short> *)&pBVar2->field_0x1) {
      SelectionVector::get_index(in_R9,(idx_t)pBVar2);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffffb8,(idx_t)pBVar2);
      if (bVar1) {
        BitwiseOperation::Operation<short,duckdb::BitState<unsigned_short>,duckdb::BitXorOperation>
                  (pBVar2,in_stack_ffffffffffffffa8,(AggregateUnaryInput *)0x98b10c);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}